

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ec_test.cc
# Opt level: O1

void __thiscall
anon_unknown.dwarf_5c29f0::ECCurveTest_EncodeInfinity_Test::TestBody
          (ECCurveTest_EncodeInfinity_Test *this)

{
  int iVar1;
  char *in_R9;
  pointer *__ptr_1;
  char *pcVar2;
  pointer *__ptr;
  AssertionResult gtest_ar_;
  UniquePtr<EC_POINT> inf;
  uint8_t buf [128];
  _Head_base<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
  local_c0;
  AssertHelper local_b8;
  internal local_b0 [8];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *local_a8;
  _Head_base<0UL,_ec_point_st_*,_false> local_a0;
  string local_98 [4];
  
  local_a0._M_head_impl = (ec_point_st *)EC_POINT_new((EC_GROUP *)(this->super_ECCurveTest).group_);
  local_b0[0] = (internal)(local_a0._M_head_impl != (ec_point_st *)0x0);
  local_a8 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
  if (local_a0._M_head_impl == (ec_point_st *)0x0) {
    testing::Message::Message((Message *)&local_c0);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              (local_98,local_b0,(AssertionResult *)0x555140,"false","true",in_R9);
    testing::internal::AssertHelper::AssertHelper
              (&local_b8,kFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/crypto/fipsmodule/ec/ec_test.cc"
               ,0x3c2,local_98[0]._M_dataplus._M_p);
    testing::internal::AssertHelper::operator=(&local_b8,(Message *)&local_c0);
  }
  else {
    pcVar2 = "";
    iVar1 = EC_POINT_oct2point((EC_GROUP *)(this->super_ECCurveTest).group_,
                               (EC_POINT *)local_a0._M_head_impl,(uchar *)"",1,(BN_CTX *)0x0);
    local_b0[0] = (internal)(iVar1 == 0);
    local_a8 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
    if (!(bool)local_b0[0]) {
      testing::Message::Message((Message *)&local_c0);
      testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
                (local_98,local_b0,
                 (AssertionResult *)
                 "EC_POINT_oct2point(group(), inf.get(), kInfinity, sizeof(kInfinity), nullptr)",
                 "true","false",in_R9);
      testing::internal::AssertHelper::AssertHelper
                (&local_b8,kNonFatalFailure,
                 "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/crypto/fipsmodule/ec/ec_test.cc"
                 ,0x3c4,local_98[0]._M_dataplus._M_p);
      testing::internal::AssertHelper::operator=(&local_b8,(Message *)&local_c0);
      testing::internal::AssertHelper::~AssertHelper(&local_b8);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_98[0]._M_dataplus._M_p != &local_98[0].field_2) {
        operator_delete(local_98[0]._M_dataplus._M_p,local_98[0].field_2._M_allocated_capacity + 1);
      }
      if (local_c0._M_head_impl !=
          (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
        (**(code **)(*(long *)local_c0._M_head_impl + 8))();
      }
    }
    if (local_a8 != (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      std::
      default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
      ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                    *)&local_a8,local_a8);
    }
    iVar1 = EC_POINT_set_to_infinity
                      ((EC_GROUP *)(this->super_ECCurveTest).group_,
                       (EC_POINT *)local_a0._M_head_impl);
    local_b0[0] = (internal)(iVar1 != 0);
    local_a8 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
    if ((bool)local_b0[0]) {
      local_b8.data_._0_4_ = 0;
      local_c0._M_head_impl =
           (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)
           EC_POINT_point2oct((EC_GROUP *)(this->super_ECCurveTest).group_,
                              (EC_POINT *)local_a0._M_head_impl,POINT_CONVERSION_UNCOMPRESSED,
                              (uchar *)local_98,0x80,(BN_CTX *)0x0);
      testing::internal::CmpHelperEQ<unsigned_int,unsigned_long>
                (local_b0,"0u",
                 "EC_POINT_point2oct(group(), inf.get(), POINT_CONVERSION_UNCOMPRESSED, buf, sizeof(buf), nullptr)"
                 ,(uint *)&local_b8,(unsigned_long *)&local_c0);
      if (local_b0[0] == (internal)0x0) {
        testing::Message::Message((Message *)&local_c0);
        if (local_a8 != (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
          pcVar2 = (local_a8->_M_dataplus)._M_p;
        }
        testing::internal::AssertHelper::AssertHelper
                  (&local_b8,kNonFatalFailure,
                   "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/crypto/fipsmodule/ec/ec_test.cc"
                   ,0x3cb,pcVar2);
        testing::internal::AssertHelper::operator=(&local_b8,(Message *)&local_c0);
        testing::internal::AssertHelper::~AssertHelper(&local_b8);
        if (local_c0._M_head_impl !=
            (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
          (**(code **)(*(long *)local_c0._M_head_impl + 8))();
        }
      }
      if (local_a8 != (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
        std::
        default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
        ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                      *)&local_a8,local_a8);
      }
      local_b8.data_._0_4_ = 0;
      local_c0._M_head_impl =
           (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)
           EC_POINT_point2oct((EC_GROUP *)(this->super_ECCurveTest).group_,
                              (EC_POINT *)local_a0._M_head_impl,POINT_CONVERSION_UNCOMPRESSED,
                              (uchar *)0x0,0,(BN_CTX *)0x0);
      testing::internal::CmpHelperEQ<unsigned_int,unsigned_long>
                (local_b0,"0u",
                 "EC_POINT_point2oct(group(), inf.get(), POINT_CONVERSION_UNCOMPRESSED, nullptr, 0, nullptr)"
                 ,(uint *)&local_b8,(unsigned_long *)&local_c0);
      if (local_b0[0] == (internal)0x0) {
        testing::Message::Message((Message *)&local_c0);
        if (local_a8 == (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
          pcVar2 = "";
        }
        else {
          pcVar2 = (local_a8->_M_dataplus)._M_p;
        }
        testing::internal::AssertHelper::AssertHelper
                  (&local_b8,kNonFatalFailure,
                   "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/crypto/fipsmodule/ec/ec_test.cc"
                   ,0x3d0,pcVar2);
        testing::internal::AssertHelper::operator=(&local_b8,(Message *)&local_c0);
        testing::internal::AssertHelper::~AssertHelper(&local_b8);
        if (local_c0._M_head_impl !=
            (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
          (**(code **)(*(long *)local_c0._M_head_impl + 8))();
        }
      }
      goto joined_r0x002edce6;
    }
    testing::Message::Message((Message *)&local_c0);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              (local_98,local_b0,(AssertionResult *)"EC_POINT_set_to_infinity(group(), inf.get())",
               "false","true",in_R9);
    testing::internal::AssertHelper::AssertHelper
              (&local_b8,kFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/crypto/fipsmodule/ec/ec_test.cc"
               ,0x3c7,local_98[0]._M_dataplus._M_p);
    testing::internal::AssertHelper::operator=(&local_b8,(Message *)&local_c0);
  }
  testing::internal::AssertHelper::~AssertHelper(&local_b8);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_98[0]._M_dataplus._M_p != &local_98[0].field_2) {
    operator_delete(local_98[0]._M_dataplus._M_p,local_98[0].field_2._M_allocated_capacity + 1);
  }
  if (local_c0._M_head_impl !=
      (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
    (**(code **)(*(long *)local_c0._M_head_impl + 8))();
  }
joined_r0x002edce6:
  if (local_a8 != (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
    std::
    default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                  *)&local_a8,local_a8);
  }
  std::unique_ptr<ec_point_st,_bssl::internal::Deleter>::~unique_ptr
            ((unique_ptr<ec_point_st,_bssl::internal::Deleter> *)&local_a0);
  return;
}

Assistant:

TEST_P(ECCurveTest, EncodeInfinity) {
  // The point at infinity is encoded as a single zero byte, but we do not
  // support it.
  static const uint8_t kInfinity[] = {0};
  bssl::UniquePtr<EC_POINT> inf(EC_POINT_new(group()));
  ASSERT_TRUE(inf);
  EXPECT_FALSE(EC_POINT_oct2point(group(), inf.get(), kInfinity,
                                  sizeof(kInfinity), nullptr));

  // Encoding it also fails.
  ASSERT_TRUE(EC_POINT_set_to_infinity(group(), inf.get()));
  uint8_t buf[128];
  EXPECT_EQ(
      0u, EC_POINT_point2oct(group(), inf.get(), POINT_CONVERSION_UNCOMPRESSED,
                             buf, sizeof(buf), nullptr));

  // Measuring the length of the encoding also fails.
  EXPECT_EQ(
      0u, EC_POINT_point2oct(group(), inf.get(), POINT_CONVERSION_UNCOMPRESSED,
                             nullptr, 0, nullptr));
}